

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_ctx.cc
# Opt level: O0

int EVP_PKEY_paramgen(EVP_PKEY_CTX *ctx,EVP_PKEY **ppkey)

{
  int iVar1;
  EVP_PKEY *pEVar2;
  EVP_PKEY **out_pkey_local;
  EVP_PKEY_CTX *ctx_local;
  
  if (((ctx == (EVP_PKEY_CTX *)0x0) || (*(long *)ctx == 0)) || (*(long *)(*(long *)ctx + 0x68) == 0)
     ) {
    ERR_put_error(6,0,0x7d,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                  ,0x19d);
    ctx_local._4_4_ = 0;
  }
  else if (*(int *)(ctx + 0x20) == 0x200) {
    if (ppkey == (EVP_PKEY **)0x0) {
      ctx_local._4_4_ = 0;
    }
    else {
      if (*ppkey == (EVP_PKEY *)0x0) {
        pEVar2 = EVP_PKEY_new();
        *ppkey = pEVar2;
        if (*ppkey == (EVP_PKEY *)0x0) {
          ERR_put_error(6,0,6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                        ,0x1ac);
          return 0;
        }
      }
      iVar1 = (**(code **)(*(long *)ctx + 0x68))(ctx,*ppkey);
      if (iVar1 == 0) {
        EVP_PKEY_free(*ppkey);
        *ppkey = (EVP_PKEY *)0x0;
        ctx_local._4_4_ = 0;
      }
      else {
        ctx_local._4_4_ = 1;
      }
    }
  }
  else {
    ERR_put_error(6,0,0x7e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                  ,0x1a1);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int EVP_PKEY_paramgen(EVP_PKEY_CTX *ctx, EVP_PKEY **out_pkey) {
  if (!ctx || !ctx->pmeth || !ctx->pmeth->paramgen) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_OPERATION_NOT_SUPPORTED_FOR_THIS_KEYTYPE);
    return 0;
  }
  if (ctx->operation != EVP_PKEY_OP_PARAMGEN) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_OPERATON_NOT_INITIALIZED);
    return 0;
  }

  if (!out_pkey) {
    return 0;
  }

  if (!*out_pkey) {
    *out_pkey = EVP_PKEY_new();
    if (!*out_pkey) {
      OPENSSL_PUT_ERROR(EVP, ERR_LIB_EVP);
      return 0;
    }
  }

  if (!ctx->pmeth->paramgen(ctx, *out_pkey)) {
    EVP_PKEY_free(*out_pkey);
    *out_pkey = NULL;
    return 0;
  }
  return 1;
}